

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O2

Ref trun::TestRunner::GetCurrentTestModule(void)

{
  __shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ref RVar2;
  
  p_Var1 = (__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)_ZTWL13threadContext();
  std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)in_RDI,p_Var1);
  RVar2.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar2.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ref)RVar2.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestModule::Ref TestRunner::GetCurrentTestModule() {
    return threadContext.currentTestModule;
}